

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

size_t nivalis::detail::print_ast_latex(ostream *os,AST *ast,Environment *env,size_t idx)

{
  char cVar1;
  pointer pAVar2;
  char *__s;
  size_t sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  size_t idx_00;
  size_t i;
  ulong uVar6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  
  __s = OpCode::latex_repr((ast->
                           super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                           )._M_impl.super__Vector_impl_data._M_start[idx].opcode);
  idx_00 = idx + 1;
  pAVar2 = (ast->super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pAVar2[idx].opcode == 0xc) {
    if (env == (Environment *)0x0) {
      poVar5 = std::operator<<(os,"<function id=");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      poVar5 = std::operator<<(poVar5,", ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5," args>");
    }
    else {
      std::operator<<(os,(string *)
                         ((env->funcs).
                          super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                         pAVar2[idx].field_1.call_info[0]));
    }
    uVar9 = (ulong)(ast->
                   super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                   )._M_impl.super__Vector_impl_data._M_start[idx].field_1.call_info[1];
    if (uVar9 != 0) {
      std::operator<<(os,"\\left(");
      for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
        if (uVar6 != 0) {
          std::operator<<(os,",");
        }
        idx_00 = print_ast_latex(os,ast,env,idx_00);
      }
      std::operator<<(os,"\\right)");
    }
  }
  else {
    sVar3 = strlen(__s);
    for (sVar8 = 0; sVar3 != sVar8; sVar8 = sVar8 + 1) {
      cVar1 = __s[sVar8];
      if (cVar1 != '\t') {
        if (cVar1 == '\v') {
          std::ostream::_M_insert<double>
                    ((ast->
                     super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                     )._M_impl.super__Vector_impl_data._M_start[idx].field_1.val);
        }
        else if (cVar1 == '\r') {
          if (env == (Environment *)0x0) {
            pcVar7 = "\\@";
            goto LAB_00110eea;
          }
          uVar9 = (ast->
                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                  )._M_impl.super__Vector_impl_data._M_start[idx].field_1.ref;
          if (uVar9 < (ulong)((long)(env->vars).super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(env->vars).super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3)) {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at(&env->varname,uVar9);
            std::operator<<(os,(string *)pvVar4);
          }
          else {
            std::operator<<(os,"\\&NULL");
          }
        }
        else if (cVar1 == '$') {
          pcVar7 = "\\$";
LAB_00110eea:
          poVar5 = std::operator<<(os,pcVar7);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        }
        else if (cVar1 == '@') {
          idx_00 = print_ast_latex(os,ast,env,idx_00);
        }
        else {
          std::operator<<(os,cVar1);
        }
      }
    }
  }
  return idx_00;
}

Assistant:

size_t print_ast_latex(std::ostream& os, const Expr::AST& ast,
               const Environment* env, size_t idx) {
    std::string_view reprs = OpCode::latex_repr(ast[idx].opcode);
    size_t n_idx = idx + 1;
    if (ast[idx].opcode == OpCode::call) {
        // Special handling for user function
        if (env != nullptr) {
            os << env->funcs[ast[idx].call_info[0]].name;
        } else {
            os << "<function id=" << ast[idx].call_info[0] << ", " << ast[idx].call_info[1] << " args>";
        }
        size_t n_args = ast[idx].call_info[1];
        if (n_args) {
            os << "\\left(";
            for (size_t i = 0; i < n_args; ++i) {
                if (i) os << ",";
                n_idx = print_ast_latex(os, ast, env, n_idx);
            }
            os << "\\right)";
        }
    } else {
        for (char c : reprs) {
            switch(c) {
                case '@': n_idx = print_ast_latex(os, ast, env, n_idx); break; // subexpr
                case '\v': os << ast[idx].val; break; // value
                case '\r':
                          if (env != nullptr) {
                              if (ast[idx].ref >= env->vars.size()) {
                                  os << "\\&NULL";
                                  break;
                              } os << env->varname.at(ast[idx].ref);
                          }
                          else os << "\\@" << ast[idx].ref;
                          break; // ref
                case '\t':
                          // Not used
                          break;
                case '$':
                          os << "\\$" << ast[idx].ref;
                          break;
                default: os << c;
            }
        }
    }
    return n_idx;
}